

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305_prov.c
# Opt level: O0

void * poly1305_dup(void *vsrc)

{
  int iVar1;
  long in_RDI;
  poly1305_data_st *dst;
  poly1305_data_st *src;
  void *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = poly1305_new(in_stack_ffffffffffffffd8);
    if (local_8 == (void *)0x0) {
      local_8 = (void *)0x0;
    }
    else {
      memcpy((void *)((long)local_8 + 8),(void *)(in_RDI + 8),0xf8);
    }
  }
  return local_8;
}

Assistant:

static void *poly1305_dup(void *vsrc)
{
    struct poly1305_data_st *src = vsrc;
    struct poly1305_data_st *dst;

    if (!ossl_prov_is_running())
        return NULL;
    dst = poly1305_new(src->provctx);
    if (dst == NULL)
        return NULL;

    dst->poly1305 = src->poly1305;
    return dst;
}